

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_DigestUpdate
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pPart,CK_ULONG ulPartLen)

{
  int iVar1;
  uint uVar2;
  Session *this_00;
  HashAlgorithm *pHVar3;
  long in_RDX;
  size_t in_RDI;
  ByteString data;
  Session *session;
  undefined7 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ByteString *in_stack_ffffffffffffffa0;
  undefined1 local_58 [24];
  CK_SESSION_HANDLE in_stack_ffffffffffffffc0;
  HandleManager *in_stack_ffffffffffffffc8;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RDX == 0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar1 = Session::getOpType(this_00);
      if (iVar1 == 4) {
        ByteString::ByteString
                  (in_stack_ffffffffffffffa0,
                   (uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_RDI);
        pHVar3 = Session::getDigestOp(this_00);
        uVar2 = (*pHVar3->_vptr_HashAlgorithm[3])(pHVar3,local_58);
        if ((uVar2 & 1) == 0) {
          Session::resetOp((Session *)CONCAT17((char)uVar2,in_stack_ffffffffffffff80));
          local_8 = 5;
        }
        else {
          local_8 = 0;
        }
        ByteString::~ByteString((ByteString *)0x16d06c);
      }
      else {
        local_8 = 0x91;
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_DigestUpdate(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pPart, CK_ULONG ulPartLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pPart == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_DIGEST) return CKR_OPERATION_NOT_INITIALIZED;

	// Get the data
	ByteString data(pPart, ulPartLen);

	// Digest the data
	if (session->getDigestOp()->hashUpdate(data) == false)
	{
		session->resetOp();
		return CKR_GENERAL_ERROR;
	}

	return CKR_OK;
}